

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlStringDecodeEntities(void)

{
  xmlChar val;
  xmlChar val_00;
  xmlChar val_01;
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr val_02;
  xmlChar *val_03;
  xmlChar *val_04;
  int local_54;
  int n_end3;
  xmlChar end3;
  int n_end2;
  xmlChar end2;
  int n_end;
  xmlChar end;
  int n_what;
  int what;
  int n_str;
  xmlChar *str;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (str._4_4_ = 0; (int)str._4_4_ < 3; str._4_4_ = str._4_4_ + 1) {
    for (n_what = 0; n_what < 5; n_what = n_what + 1) {
      for (n_end = 0; n_end < 4; n_end = n_end + 1) {
        for (n_end2 = 0; n_end2 < 4; n_end2 = n_end2 + 1) {
          for (n_end3 = 0; n_end3 < 4; n_end3 = n_end3 + 1) {
            for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
              iVar1 = xmlMemBlocks();
              val_02 = gen_xmlParserCtxtPtr(str._4_4_,0);
              val_03 = gen_const_xmlChar_ptr(n_what,1);
              iVar2 = gen_int(n_end,2);
              val = gen_xmlChar(n_end2,3);
              val_00 = gen_xmlChar(n_end3,4);
              val_01 = gen_xmlChar(local_54,5);
              val_04 = (xmlChar *)xmlStringDecodeEntities(val_02,val_03,iVar2,val,val_00,val_01);
              desret_xmlChar_ptr(val_04);
              call_tests = call_tests + 1;
              des_xmlParserCtxtPtr(str._4_4_,val_02,0);
              des_const_xmlChar_ptr(n_what,val_03,1);
              des_int(n_end,iVar2,2);
              des_xmlChar(n_end2,val,3);
              des_xmlChar(n_end3,val_00,4);
              des_xmlChar(local_54,val_01,5);
              xmlResetLastError();
              iVar2 = xmlMemBlocks();
              if (iVar1 != iVar2) {
                iVar2 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlStringDecodeEntities",
                       (ulong)(uint)(iVar2 - iVar1));
                ret_val._4_4_ = ret_val._4_4_ + 1;
                printf(" %d",(ulong)str._4_4_);
                printf(" %d",(ulong)(uint)n_what);
                printf(" %d",(ulong)(uint)n_end);
                printf(" %d",(ulong)(uint)n_end2);
                printf(" %d",(ulong)(uint)n_end3);
                printf(" %d");
                printf("\n");
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlStringDecodeEntities(void) {
    int test_ret = 0;

    int mem_base;
    xmlChar * ret_val;
    xmlParserCtxtPtr ctxt; /* the parser context */
    int n_ctxt;
    xmlChar * str; /* the input string */
    int n_str;
    int what; /* combination of XML_SUBSTITUTE_REF and XML_SUBSTITUTE_PEREF */
    int n_what;
    xmlChar end; /* an end marker xmlChar, 0 if none */
    int n_end;
    xmlChar end2; /* an end marker xmlChar, 0 if none */
    int n_end2;
    xmlChar end3; /* an end marker xmlChar, 0 if none */
    int n_end3;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_str = 0;n_str < gen_nb_const_xmlChar_ptr;n_str++) {
    for (n_what = 0;n_what < gen_nb_int;n_what++) {
    for (n_end = 0;n_end < gen_nb_xmlChar;n_end++) {
    for (n_end2 = 0;n_end2 < gen_nb_xmlChar;n_end2++) {
    for (n_end3 = 0;n_end3 < gen_nb_xmlChar;n_end3++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        str = gen_const_xmlChar_ptr(n_str, 1);
        what = gen_int(n_what, 2);
        end = gen_xmlChar(n_end, 3);
        end2 = gen_xmlChar(n_end2, 4);
        end3 = gen_xmlChar(n_end3, 5);

        ret_val = xmlStringDecodeEntities(ctxt, (const xmlChar *)str, what, end, end2, end3);
        desret_xmlChar_ptr(ret_val);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_const_xmlChar_ptr(n_str, (const xmlChar *)str, 1);
        des_int(n_what, what, 2);
        des_xmlChar(n_end, end, 3);
        des_xmlChar(n_end2, end2, 4);
        des_xmlChar(n_end3, end3, 5);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlStringDecodeEntities",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_str);
            printf(" %d", n_what);
            printf(" %d", n_end);
            printf(" %d", n_end2);
            printf(" %d", n_end3);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}